

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<Minisat::Solver::VarOrderLt>::insert(Heap<Minisat::Solver::VarOrderLt> *this,int n)

{
  int local_18;
  int local_14;
  
  local_18 = -1;
  local_14 = n;
  vec<int>::growTo(&this->indices,n + 1,&local_18);
  (this->indices).data[local_14] = (this->heap).sz;
  vec<int>::push(&this->heap,&local_14);
  percolateUp(this,(this->indices).data[local_14]);
  return;
}

Assistant:

void insert(int n)
    {
        indices.growTo(n + 1, -1);
        assert(!inHeap(n));

        indices[n] = heap.size();
        heap.push(n);
        percolateUp(indices[n]);
    }